

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 get_temp_i32(DisasContext_conflict8 *dc)

{
  int iVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 t;
  TCGContext_conflict8 *tcg_ctx;
  DisasContext_conflict8 *dc_local;
  
  if ((uint)dc->n_t32 < 3) {
    pTVar2 = tcg_temp_new_i32(dc->uc->tcg_ctx);
    iVar1 = dc->n_t32;
    dc->n_t32 = iVar1 + 1;
    dc->t32[iVar1] = pTVar2;
    return pTVar2;
  }
  __assert_fail("dc->n_t32 < ARRAY_SIZE(dc->t32)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                ,0x73,"TCGv_i32 get_temp_i32(DisasContext *)");
}

Assistant:

static inline TCGv_i32 get_temp_i32(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    TCGv_i32 t;
    assert(dc->n_t32 < ARRAY_SIZE(dc->t32));
    dc->t32[dc->n_t32++] = t = tcg_temp_new_i32(tcg_ctx);
    return t;
}